

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTDMT_freeCCtx(ZSTDMT_CCtx *mtctx)

{
  ZSTD_customMem *pZVar1;
  BYTE *ptr;
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  ZSTD_customMem cMem;
  
  if (mtctx != (ZSTDMT_CCtx *)0x0) {
    if ((mtctx->field_0xc08 & 1) == 0) {
      POOL_free(mtctx->factory);
    }
    ZSTDMT_releaseAllJobResources(mtctx);
    ZSTDMT_freeJobsTable(mtctx->jobs,mtctx->jobIDMask + 1,mtctx->cMem);
    ZSTDMT_freeBufferPool(mtctx->bufPool);
    ZSTDMT_freeCCtxPool(mtctx->cctxPool);
    ZSTDMT_freeBufferPool(mtctx->seqPool);
    pZVar1 = &(mtctx->serial).params.customMem;
    customMem_00 = *pZVar1;
    customMem = *pZVar1;
    pthread_mutex_destroy((pthread_mutex_t *)&mtctx->serial);
    pthread_cond_destroy((pthread_cond_t *)&(mtctx->serial).cond);
    pthread_mutex_destroy((pthread_mutex_t *)&(mtctx->serial).ldmWindowMutex);
    pthread_cond_destroy((pthread_cond_t *)&(mtctx->serial).ldmWindowCond);
    ZSTD_customFree((mtctx->serial).ldmState.hashTable,customMem);
    ZSTD_customFree((mtctx->serial).ldmState.bucketOffsets,customMem_00);
    ZSTD_freeCDict(mtctx->cdictLocal);
    ptr = (mtctx->roundBuff).buffer;
    if (ptr != (BYTE *)0x0) {
      ZSTD_customFree(ptr,mtctx->cMem);
    }
    ZSTD_customFree(mtctx,mtctx->cMem);
  }
  return 0;
}

Assistant:

size_t ZSTDMT_freeCCtx(ZSTDMT_CCtx* mtctx)
{
    if (mtctx==NULL) return 0;   /* compatible with free on NULL */
    if (!mtctx->providedFactory)
        POOL_free(mtctx->factory);   /* stop and free worker threads */
    ZSTDMT_releaseAllJobResources(mtctx);  /* release job resources into pools first */
    ZSTDMT_freeJobsTable(mtctx->jobs, mtctx->jobIDMask+1, mtctx->cMem);
    ZSTDMT_freeBufferPool(mtctx->bufPool);
    ZSTDMT_freeCCtxPool(mtctx->cctxPool);
    ZSTDMT_freeSeqPool(mtctx->seqPool);
    ZSTDMT_serialState_free(&mtctx->serial);
    ZSTD_freeCDict(mtctx->cdictLocal);
    if (mtctx->roundBuff.buffer)
        ZSTD_customFree(mtctx->roundBuff.buffer, mtctx->cMem);
    ZSTD_customFree(mtctx, mtctx->cMem);
    return 0;
}